

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JP2K.cpp
# Opt level: O0

h__Reader * __thiscall AS_02::JP2K::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename)

{
  bool bVar1;
  int iVar2;
  ILogSink *pIVar3;
  Result_t local_258 [104];
  undefined1 local_1f0 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  Result_t local_170 [104];
  Result_t local_108 [104];
  long local_a0;
  InterchangeObject *tmp_iobj;
  Result_t local_88 [8];
  Result_t result;
  string *filename_local;
  h__Reader *this_local;
  
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)local_88,filename);
  iVar2 = Kumu::Result_t::operator_cast_to_int(local_88);
  if (-1 < iVar2) {
    local_a0 = 0;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              ((uchar *)local_108,(InterchangeObject **)((long)&filename->field_2 + 8));
    Kumu::Result_t::~Result_t(local_108);
    if (local_a0 == 0) {
      ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
      ASDCP::MXF::OP1aHeader::GetMDObjectByType
                ((uchar *)local_170,(InterchangeObject **)((long)&filename->field_2 + 8));
      Kumu::Result_t::~Result_t(local_170);
    }
    if (local_a0 == 0) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"RGBAEssenceDescriptor nor CDCIEssenceDescriptor found.\n");
    }
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              ((uchar *)&ObjectList.
                         super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                         ._M_impl._M_node._M_size,
               (InterchangeObject **)((long)&filename->field_2 + 8));
    Kumu::Result_t::~Result_t
              ((Result_t *)
               &ObjectList.
                super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ._M_impl._M_node._M_size);
    if (local_a0 == 0) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"JPEG2000PictureSubDescriptor not found.\n");
    }
    std::__cxx11::
    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
              ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)local_1f0);
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectsByType
              ((uchar *)local_258,(list *)((filename->field_2)._M_local_buf + 8));
    Kumu::Result_t::~Result_t(local_258);
    bVar1 = std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                     *)local_1f0);
    if (bVar1) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"MXF Metadata contains no Track Sets.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
    }
    std::__cxx11::
    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
              ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)local_1f0);
    if (bVar1) goto LAB_00197e27;
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_88);
LAB_00197e27:
  Kumu::Result_t::~Result_t(local_88);
  return this;
}

Assistant:

Result_t
AS_02::JP2K::MXFReader::h__Reader::OpenRead(const std::string& filename)
{
  Result_t result = OpenMXFRead(filename);

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_iobj = 0;

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(CDCIEssenceDescriptor), &tmp_iobj);

      if ( tmp_iobj == 0 )
	{
	  m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(RGBAEssenceDescriptor), &tmp_iobj);
	}

      if ( tmp_iobj == 0 )
	{
	  DefaultLogSink().Error("RGBAEssenceDescriptor nor CDCIEssenceDescriptor found.\n");
	}

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(JPEG2000PictureSubDescriptor), &tmp_iobj);

      if ( tmp_iobj == 0 )
	{
	  DefaultLogSink().Error("JPEG2000PictureSubDescriptor not found.\n");
	}

      std::list<InterchangeObject*> ObjectList;
      m_HeaderPart.GetMDObjectsByType(OBJ_TYPE_ARGS(Track), ObjectList);

      if ( ObjectList.empty() )
	{
	  DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
	  return RESULT_AS02_FORMAT;
	}
    }

  return result;
}